

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::calcNameSetsLengths(UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int local_1c;
  int32_t maxNameLength;
  int32_t i;
  UErrorCode *pErrorCode_local;
  
  if (gMaxNameLength == 0) {
    UVar1 = isDataLoaded(pErrorCode);
    if (UVar1 == '\0') {
      pErrorCode_local._7_1_ = '\0';
    }
    else {
      for (local_1c = 0; local_1c < 0x13; local_1c = local_1c + 1) {
        *(uint *)(gNameSet + (long)((int)(uint)(byte)"0123456789ABCDEF<>-"[local_1c] >> 5) * 4) =
             1 << ("0123456789ABCDEF<>-"[local_1c] & 0x1fU) |
             *(uint *)(gNameSet + (long)((int)(uint)(byte)"0123456789ABCDEF<>-"[local_1c] >> 5) * 4)
        ;
      }
      iVar2 = calcAlgNameSetsLengths(0);
      iVar2 = calcExtNameSetsLengths(iVar2);
      calcGroupNameSetsLengths(iVar2);
      pErrorCode_local._7_1_ = '\x01';
    }
  }
  else {
    pErrorCode_local._7_1_ = '\x01';
  }
  return pErrorCode_local._7_1_;
}

Assistant:

static UBool
calcNameSetsLengths(UErrorCode *pErrorCode) {
    static const char extChars[]="0123456789ABCDEF<>-";
    int32_t i, maxNameLength;

    if(gMaxNameLength!=0) {
        return TRUE;
    }

    if(!isDataLoaded(pErrorCode)) {
        return FALSE;
    }

    /* set hex digits, used in various names, and <>-, used in extended names */
    for(i=0; i<(int32_t)sizeof(extChars)-1; ++i) {
        SET_ADD(gNameSet, extChars[i]);
    }

    /* set sets and lengths from algorithmic names */
    maxNameLength=calcAlgNameSetsLengths(0);

    /* set sets and lengths from extended names */
    maxNameLength=calcExtNameSetsLengths(maxNameLength);

    /* set sets and lengths from group names, set global maximum values */
    calcGroupNameSetsLengths(maxNameLength);

    return TRUE;
}